

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::anon_unknown_14::XmlReporter::log_contexts(XmlReporter *this)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long *in_FS_OFFSET;
  ScopedElement scoped;
  stringstream ss;
  ScopedElement local_208;
  long local_200;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  detail::g_infoContexts::__tls_init();
  lVar3 = *in_FS_OFFSET;
  plVar1 = (long *)(lVar3 + -0x30);
  uVar4 = (uint)((ulong)(*(long *)(lVar3 + -0x28) - *plVar1) >> 3);
  if (uVar4 != 0) {
    detail::g_infoContexts::__tls_init();
    if ((int)((ulong)(*(long *)(lVar3 + -0x28) - *plVar1) >> 3) == 0) {
      local_200 = 0;
    }
    else {
      detail::g_infoContexts::__tls_init();
      local_200 = *plVar1;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    if (0 < (int)uVar4) {
      paVar2 = &local_1f8.field_2;
      uVar5 = 0;
      do {
        plVar1 = *(long **)(local_200 + uVar5 * 8);
        (**(code **)(*plVar1 + 0x10))(plVar1,local_1a8);
        local_1f8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Info","");
        local_208.m_writer = &this->xml;
        XmlWriter::startElement(&this->xml,&local_1f8);
        std::__cxx11::stringbuf::str();
        XmlWriter::ScopedElement::writeText(&local_208,&local_1d8,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        XmlWriter::ScopedElement::~ScopedElement(&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != paVar2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        local_1f8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
        std::__cxx11::stringbuf::str(local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != paVar2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        uVar5 = uVar5 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar5);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void log_contexts() {
            int num_contexts = get_num_active_contexts();
            if(num_contexts) {
                auto              contexts = get_active_contexts();
                std::stringstream ss;
                for(int i = 0; i < num_contexts; ++i) {
                    contexts[i]->stringify(&ss);
                    xml.scopedElement("Info").writeText(ss.str());
                    ss.str("");
                }
            }
        }